

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

void PrintStruct(FLispString *out,ZCC_TreeNode *node)

{
  FName local_14;
  
  FLispString::Break(out);
  FLispString::Open(out,"struct");
  FLispString::AddName(out,&local_14);
  PrintNodes(out,node[1].SiblingPrev,false,true);
  FLispString::Close(out);
  return;
}

Assistant:

static void PrintStruct(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_Struct *snode = (ZCC_Struct *)node;
	out.Break();
	out.Open("struct");
	out.AddName(snode->NodeName);
	PrintNodes(out, snode->Body, false, true);
	out.Close();
}